

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_fdset(CURLM *multi_handle,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  uint uVar1;
  int local_74;
  int local_70;
  curl_socket_t s;
  int i;
  int bitmap;
  curl_socket_t sockbunch [5];
  int local_4c;
  SessionHandle *pSStack_48;
  int this_max_fd;
  SessionHandle *data;
  Curl_multi *multi;
  int *max_fd_local;
  fd_set *exc_fd_set_local;
  fd_set *write_fd_set_local;
  fd_set *read_fd_set_local;
  CURLM *multi_handle_local;
  
  local_4c = -1;
  if ((multi_handle == (CURLM *)0x0) || (*multi_handle != 0xbab1e)) {
    multi_handle_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else {
    for (pSStack_48 = *(SessionHandle **)((long)multi_handle + 8);
        pSStack_48 != (SessionHandle *)0x0; pSStack_48 = pSStack_48->next) {
      uVar1 = multi_getsock(pSStack_48,&i,5);
      for (local_70 = 0; local_70 < 5; local_70 = local_70 + 1) {
        local_74 = -1;
        if ((((uVar1 & 1 << ((byte)local_70 & 0x1f)) != 0) && (-1 < (&i)[local_70])) &&
           ((&i)[local_70] < 0x400)) {
          read_fd_set->__fds_bits[(&i)[local_70] / 0x40] =
               1L << ((byte)((long)(&i)[local_70] % 0x40) & 0x3f) |
               read_fd_set->__fds_bits[(&i)[local_70] / 0x40];
          local_74 = (&i)[local_70];
        }
        if ((((uVar1 & 1 << ((byte)local_70 + 0x10 & 0x1f)) != 0) && (-1 < (&i)[local_70])) &&
           ((&i)[local_70] < 0x400)) {
          write_fd_set->__fds_bits[(&i)[local_70] / 0x40] =
               1L << ((byte)((long)(&i)[local_70] % 0x40) & 0x3f) |
               write_fd_set->__fds_bits[(&i)[local_70] / 0x40];
          local_74 = (&i)[local_70];
        }
        if (local_74 == -1) break;
        if (local_4c < local_74) {
          local_4c = local_74;
        }
      }
    }
    *max_fd = local_4c;
    multi_handle_local._4_4_ = CURLM_OK;
  }
  return multi_handle_local._4_4_;
}

Assistant:

CURLMcode curl_multi_fdset(CURLM *multi_handle,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  int this_max_fd=-1;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if((bitmap & GETSOCK_READSOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], read_fd_set);
        s = sockbunch[i];
      }
      if((bitmap & GETSOCK_WRITESOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], write_fd_set);
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD)
        /* this socket is unused, break out of loop */
        break;
      else {
        if((int)s > this_max_fd)
          this_max_fd = (int)s;
      }
    }

    data = data->next; /* check next handle */
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}